

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReportUnexpectedOpcode
          (BinaryReader *this,Opcode opcode,char *where)

{
  iterator __begin2;
  byte *pbVar1;
  string message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Opcode local_94;
  BinaryReader *local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_88[0] = local_78;
  local_94.enum_ = opcode.enum_;
  local_90 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"unexpected opcode","");
  if (where != (char *)0x0) {
    std::__cxx11::string::push_back((char)local_88);
    std::__cxx11::string::append((char *)local_88);
  }
  std::__cxx11::string::append((char *)local_88);
  Opcode::GetBytes(&local_48,&local_94);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pbVar1 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      StringPrintf_abi_cxx11_(&local_68," 0x%x",(ulong)*pbVar1);
      std::__cxx11::string::_M_append((char *)local_88,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pbVar1 = pbVar1 + 1;
    } while (pbVar1 != local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    PrintError(local_90,"%s",local_88[0]);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    return (Result)Error;
  }
  __assert_fail("bytes.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-reader.cc"
                ,0xdd,
                "Result wabt::(anonymous namespace)::BinaryReader::ReportUnexpectedOpcode(Opcode, const char *)"
               );
}

Assistant:

Result BinaryReader::ReportUnexpectedOpcode(Opcode opcode, const char* where) {
  std::string message = "unexpected opcode";
  if (where) {
    message += ' ';
    message += where;
  }

  message += ":";

  std::vector<uint8_t> bytes = opcode.GetBytes();
  assert(bytes.size() > 0);

  for (uint8_t byte : bytes) {
    message += StringPrintf(" 0x%x", byte);
  }

  PrintError("%s", message.c_str());
  return Result::Error;
}